

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  float *pfVar10;
  long lVar11;
  int j;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  int iVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  long local_90;
  
  uVar3 = this->kStateCount;
  iVar17 = uVar3 + 1;
  uVar4 = this->kCategoryCount;
  iVar5 = this->kPartialsPaddedStateCount;
  lVar11 = (long)iVar5;
  iVar6 = this->kPatternCount;
  iVar7 = this->kMatrixSize;
  local_b0 = matrices1 + 3;
  local_a8 = matrices2 + 3;
  iVar9 = iVar5 * startPattern;
  local_a0 = matrices1;
  local_98 = matrices2;
  for (uVar15 = 0; uVar15 != (~((int)uVar4 >> 0x1f) & uVar4); uVar15 = uVar15 + 1) {
    local_90 = 0;
    pfVar19 = destP + (iVar6 * (int)uVar15 + startPattern) * iVar5;
    pfVar10 = partials1 + iVar9;
    pfVar18 = partials2 + iVar9;
    for (iVar13 = startPattern; iVar13 < endPattern; iVar13 = iVar13 + 1) {
      pfVar16 = local_98;
      pfVar21 = local_b0;
      pfVar22 = local_a0;
      pfVar23 = local_a8;
      for (uVar14 = 0; uVar14 != (~((int)uVar3 >> 0x1f) & uVar3); uVar14 = uVar14 + 1) {
        auVar25 = ZEXT816(0) << 0x40;
        lVar12 = 0;
        pfVar8 = pfVar22;
        pfVar20 = pfVar16;
        lVar24 = local_90;
        while (lVar12 < (int)uVar3 / 4 << 2) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(pfVar21 + lVar12 + -3);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(pfVar10 + lVar12);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(pfVar21 + lVar12 + -1);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(pfVar10 + lVar12 + 2);
          lVar24 = lVar24 + 0x10;
          pfVar20 = pfVar20 + 4;
          pfVar8 = pfVar8 + 4;
          auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)pfVar23[lVar12 + -3]),0x20);
          auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)pfVar18[lVar12]),0x20);
          auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)pfVar23[lVar12 + -2]),0x30);
          auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)pfVar18[lVar12 + 1]),0x30);
          auVar28 = vfmadd213ps_fma(auVar28,auVar26,auVar25);
          auVar25 = vinsertps_avx(auVar27,ZEXT416((uint)pfVar23[lVar12 + -1]),0x20);
          auVar25 = vinsertps_avx(auVar25,ZEXT416((uint)pfVar23[lVar12]),0x30);
          auVar26 = vinsertps_avx(auVar29,ZEXT416((uint)pfVar18[lVar12 + 2]),0x20);
          auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)pfVar18[lVar12 + 3]),0x30);
          lVar12 = lVar12 + 4;
          auVar25 = vfmadd213ps_fma(auVar26,auVar25,auVar28);
        }
        auVar26 = vshufpd_avx(auVar25,auVar25,1);
        auVar28 = auVar25;
        while (lVar12 < (int)uVar3) {
          fVar1 = *pfVar8;
          fVar2 = *pfVar20;
          lVar12 = lVar12 + 1;
          pfVar20 = pfVar20 + 1;
          pfVar8 = pfVar8 + 1;
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar1),
                                    ZEXT416(*(uint *)((long)(partials1 + iVar9) + lVar24)));
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar2),
                                    ZEXT416(*(uint *)((long)(partials2 + iVar9) + lVar24)));
          lVar24 = lVar24 + 4;
        }
        auVar27 = vmovshdup_avx(auVar25);
        auVar25 = vshufps_avx(auVar25,auVar25,0xff);
        pfVar23 = pfVar23 + iVar17;
        pfVar21 = pfVar21 + iVar17;
        pfVar16 = pfVar16 + iVar17;
        pfVar22 = pfVar22 + iVar17;
        *pfVar19 = (auVar27._0_4_ + auVar28._0_4_) * (auVar25._0_4_ + auVar26._0_4_);
        pfVar19 = pfVar19 + 1;
      }
      local_90 = local_90 + lVar11 * 4;
      pfVar18 = pfVar18 + lVar11;
      pfVar10 = pfVar10 + lVar11;
    }
    iVar9 = iVar9 + iVar6 * iVar5;
    local_a8 = local_a8 + iVar7;
    local_b0 = local_b0 + iVar7;
    local_98 = local_98 + iVar7;
    local_a0 = local_a0 + iVar7;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                             const REALTYPE* partials1,
                                                             const REALTYPE* matrices1,
                                                             const REALTYPE* partials2,
                                                             const REALTYPE* matrices2,
                                                             int startPattern,
                                                             int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {

            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B);
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}